

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cache.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  time_t tVar5;
  char *__dest;
  record_data *prVar6;
  clock_t cVar7;
  clock_t cVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int i;
  uint uVar14;
  bool bVar15;
  ulong local_358;
  record_data tmp_data;
  record_data *send_data [10];
  record_data _data [10];
  
  log_set_level(2);
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  init_records();
  init_A_record_cache_default(&testcache);
  tmp_data.next = (record_data *)0x0;
  __dest = (char *)malloc(0x100);
  tmp_data.label = __dest;
  strcpy(__dest,records[0].label);
  tmp_data.ip.addr = records[0].ip.addr;
  tmp_data.ip.type = records[0].ip.type;
  tmp_data.ip._17_7_ = records[0].ip._17_7_;
  tmp_data.ip._24_8_ = records[0].ip._24_8_;
  tVar5 = time((time_t *)0x0);
  tmp_data.ttl = tVar5 + 1000000;
  set_cache_A_record(&testcache,__dest,&tmp_data);
  prVar6 = get_cache_A_record(&testcache,records[0].label);
  if (prVar6 != (record_data *)0x0) {
    iVar13 = 100000;
    cVar7 = clock();
    while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
      iVar4 = rand();
      iVar11 = (int)((long)iVar4 % 2000);
      if (local_358 % 500 == 0) {
        local_358 = time((time_t *)0x0);
      }
      if (((long)iVar4 % 2000 & 3U) == 0) {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x3b,"set cache");
        strcpy(tmp_data.label,records[iVar11].label);
        tmp_data.ip.addr = *(ip *)(records + iVar11);
        tmp_data.ip.type = records[iVar11].ip.type;
        tmp_data.ip._17_7_ = *(undefined7 *)&records[iVar11].ip.field_0x11;
        tmp_data.ip._24_8_ = *(undefined8 *)&records[iVar11].ip.field_0x18;
        tmp_data.ttl = records[iVar11].ttl;
        set_cache_A_record(&testcache,tmp_data.label,&tmp_data);
      }
      else {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x42,"get cache");
        prVar6 = get_cache_A_record(&testcache,records[iVar11].label);
        if (prVar6 == (record_data *)0x0) {
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                  ,0x47,"No exist\n");
        }
        else {
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                  ,0x45,"%s\n",prVar6->label);
        }
      }
      test_normal(&testcache);
    }
    cVar8 = clock();
    test_normal(&testcache);
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
            ,0x4f,"test 100000 randomly insert and get successfully in %f",
            SUB84((double)(cVar8 - cVar7) / 1000000.0,0));
    for (uVar14 = 0; uVar14 != 10000; uVar14 = uVar14 + 1) {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
              ,0x54,"iter=%d\n",(ulong)uVar14);
      iVar13 = rand();
      iVar4 = (int)((long)iVar13 % 0x7cc);
      if (local_358 % 500 == 0) {
        local_358 = time((time_t *)0x0);
      }
      lVar9 = (long)iVar4;
      if (iVar4 == 0 || ((long)iVar13 % 0x7cc & 3U) != 0) {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x68,"get cache label=%s",records[lVar9].label);
        get_cache_A_record(&testcache,records[lVar9].label);
      }
      else {
        lVar10 = lVar9 * 0x130 + 0x106290;
        for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 0x40) {
          uVar1 = *(undefined8 *)(lVar10 + -0x30);
          uVar2 = *(undefined8 *)(lVar10 + -0x28);
          uVar3 = *(undefined8 *)(lVar10 + -0x18);
          *(undefined8 *)(&_data[0].ip.type + lVar12) = *(undefined8 *)(lVar10 + -0x20);
          *(undefined8 *)(&_data[0].ip.field_0x18 + lVar12) = uVar3;
          *(undefined8 *)((long)&_data[0].ip.addr + lVar12) = uVar1;
          *(undefined8 *)((long)&_data[0].ip.addr + lVar12 + 8) = uVar2;
          *(undefined8 *)((long)&_data[0].ttl + lVar12) = *(undefined8 *)(lVar10 + -0x10);
          *(long *)((long)&_data[0].label + lVar12) = lVar10;
          lVar10 = lVar10 + 0x130;
        }
        send_data[0] = _data;
        send_data[2] = _data + 1;
        send_data[1] = _data + 2;
        send_data[3] = _data + 3;
        set_cache_A_multi_record(&testcache,records[lVar9].label,send_data,4);
      }
    }
    free_cache(&testcache);
    printf(anon_var_dwarf_1f1);
    return 0;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
          ,0x33,"can\'t get cache");
  exit(0);
}

Assistant:

int main(){
    log_set_level(LOG_INFO);
    srand(time(NULL));
    init_records();
    // printf("%d",_hash("www.baidu.com1",1000))
    init_A_record_cache_default(&testcache);
    size_t now;
    // printf("%d %d",testcache.length,testcache.max_size);

    struct record_data tmp_data;
    tmp_data.next=NULL;
    tmp_data.label = malloc(256); 
    strcpy(tmp_data.label,records[0].label);
    // strcpy_s(tmp_data.label,256,records[0].label);
    tmp_data.ip = records[0].ip;
    tmp_data.ttl = time(NULL)+1000000;
    set_cache_A_record(&testcache,tmp_data.label,(void*)&tmp_data);    
    struct record_data *tmp = get_cache_A_record(&testcache,(const char*)records[0].label);
    if(!tmp){log_error("can't get cache",tmp->label);exit(0);}

    clock_t start_time = clock(),end_time;
    for (int i =0;i<100000;i++){
        int r = rand() % 2000;
        // log_debug("%d",i);
        if(now%500==0)now =time(NULL);
        if(r%4==0){
            log_debug("set cache");
            strcpy(tmp_data.label,records[r].label);
            // strcpy_s(tmp_data.label,256,records[r].label);
            tmp_data.ip = records[r].ip;
            tmp_data.ttl = records[r].ttl;
            set_cache_A_record(&testcache,tmp_data.label,&tmp_data);
        }else{
            log_debug("get cache");
            struct record_data *tmp = get_cache_A_record(&testcache,(const char*)records[r].label);
            if(tmp)
                log_debug("%s\n",tmp->label);
            else   
                log_debug("No exist\n");
        }
        // printf("%s\n",records[r].label);
        test_normal(&testcache);
        // printf("\n");
    }
    end_time = clock();
    test_normal(&testcache);
    log_info("test 100000 randomly insert and get successfully in %f",(double)(end_time - start_time) / CLOCKS_PER_SEC);

    struct record_data* send_data[10];
    struct record_data _data[10];
    for (int i =0;i<10000;i++){
        log_debug("iter=%d\n",i);
        int r = rand() % 1996;
        if(now%500==0)now =time(NULL);

        if(r%4==0&&r!=0){
            for(int j=0;j<4;j++){
                memcpy(&_data[j].ip,&records[r+j].ip,sizeof(struct IP));
                // memcpy_s(&_data[j].ip,sizeof(struct IP),&records[r+j].ip,sizeof(struct IP));
                _data[j].ttl = records[r+j].ttl;
                _data[j].label = records[r+j].label;
            }
            send_data[0] = &_data[0];
            send_data[2] = &_data[1];
            send_data[1] = &_data[2];
            send_data[3] = &_data[3];
            // printf("%s",send_data[0]->label);
            // puts(send_data[0]);
            // set_cache_A_record(&testcache,tmp_data.label,&tmp_data);
            set_cache_A_multi_record(&testcache,records[r].label,(void**)send_data,4);
        }else{
            log_debug("get cache label=%s",records[r].label);
            get_cache_A_record(&testcache,(const char*)records[r].label);
        }
    }
    // printf("%d",set_cache_A_record((const char*)&records[0].label,&records[0].ip));
    // printf("%d",_cache((const char*)&records[0].label,&records[0].ip));
    free_cache(&testcache);
    printf("恭喜！\nおめでとうございます\nCongratulations!");
    return 0;
}